

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_12::calculateNumTiles
               (int *numTiles,int numLevels,int min,int max,int size,LevelRoundingMode rmode)

{
  int iVar1;
  ArgExc *this;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int l;
  int i;
  LevelRoundingMode in_stack_ffffffffffffffd8;
  LevelRoundingMode in_stack_ffffffffffffffdc;
  int max_00;
  
  max_00 = 0;
  while( true ) {
    if (in_ESI <= max_00) {
      return;
    }
    in_stack_ffffffffffffffd8 =
         levelSize(in_R9D,max_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffdc = in_stack_ffffffffffffffd8;
    iVar1 = std::numeric_limits<int>::max();
    if ((iVar1 - in_R8D) + 1 < (int)in_stack_ffffffffffffffd8) break;
    *(int *)(in_RDI + (long)max_00 * 4) = (int)(in_stack_ffffffffffffffdc + in_R8D + -1) / in_R8D;
    max_00 = max_00 + 1;
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,"Invalid size.");
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
calculateNumTiles (int *numTiles,
		   int numLevels,
		   int min, int max,
		   int size,
		   LevelRoundingMode rmode)
{
    for (int i = 0; i < numLevels; i++)
    {
        int l = levelSize (min, max, i, rmode);
        if (l > std::numeric_limits<int>::max() - size + 1)
            throw IEX_NAMESPACE::ArgExc ("Invalid size.");

        numTiles[i] = (l + size - 1) / size;
    }
}